

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

double __thiscall
duckdb::CardinalityEstimator::GetNumerator(CardinalityEstimator *this,JoinRelationSet *set)

{
  JoinRelationSet *this_00;
  mapped_type *pmVar1;
  ulong uVar2;
  mapped_type card_helper;
  double local_90;
  string local_88;
  CardinalityHelper local_68;
  
  local_90 = 1.0;
  for (uVar2 = 0; uVar2 < set->count; uVar2 = uVar2 + 1) {
    this_00 = JoinRelationSetManager::GetJoinRelation
                        (&this->set_manager,
                         *(idx_t *)((long)(set->relations).
                                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false> + uVar2 * 8
                                   ));
    JoinRelationSet::ToString_abi_cxx11_(&local_88,this_00);
    pmVar1 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CardinalityHelper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->relation_set_2_cardinality,&local_88);
    CardinalityHelper::CardinalityHelper(&local_68,pmVar1);
    ::std::__cxx11::string::~string((string *)&local_88);
    local_90 = local_90 *
               (double)(~-(ulong)(local_68.cardinality_before_filters == 0.0) &
                        (ulong)local_68.cardinality_before_filters |
                       -(ulong)(local_68.cardinality_before_filters == 0.0) & 0x3ff0000000000000);
    CardinalityHelper::~CardinalityHelper(&local_68);
  }
  return local_90;
}

Assistant:

double CardinalityEstimator::GetNumerator(JoinRelationSet &set) {
	double numerator = 1;
	for (idx_t i = 0; i < set.count; i++) {
		auto &single_node_set = set_manager.GetJoinRelation(set.relations[i]);
		auto card_helper = relation_set_2_cardinality[single_node_set.ToString()];
		numerator *= card_helper.cardinality_before_filters == 0 ? 1 : card_helper.cardinality_before_filters;
	}
	return numerator;
}